

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_s.hpp
# Opt level: O0

iterator __thiscall
estl::
vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>::
insert(vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
       *this,const_iterator pos,
      basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  size_type sVar1;
  size_type sVar2;
  range_error *this_00;
  iterator last;
  pointer insert_ptr;
  iterator ipos;
  size_type new_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  const_iterator pos_local;
  vector_s<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_10UL>
  *this_local;
  
  sVar1 = size(this);
  sVar2 = capacity(this);
  if (sVar2 < sVar1 + 1) {
    this_00 = (range_error *)__cxa_allocate_exception(0x10);
    std::range_error::range_error(this_00,"cas::vector_s inserting beyond capacity.");
    __cxa_throw(this_00,&std::range_error::typeinfo,std::range_error::~range_error);
  }
  last = end(this);
  vector_s<std::__cxx11::string,10ul>::shift_right<std::__cxx11::string*>
            ((vector_s<std::__cxx11::string,10ul> *)this,pos,last,1);
  std::__cxx11::string::string((string *)pos,(string *)value);
  this->size_ = sVar1 + 1;
  return pos;
}

Assistant:

iterator insert(const_iterator pos, const T&& value)
    {
        const auto new_size = size() + 1u;
        if (new_size > capacity()) {
            ESTL_THROW (std::range_error, "cas::vector_s inserting beyond capacity.");
            return end();
        }

        iterator ipos = const_cast<iterator>(pos);
        shift_right(ipos, end(), 1u);// Allocates new elements

        const pointer insert_ptr = static_cast<pointer>(ipos);
        new (insert_ptr) value_type(std::move(value));
        // *ipos = std::move(value); // TODO: This seems ok too since the extra elements are already "allocated" by shift_right

        size_ = new_size;
        return ipos;
    }